

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::is_unused_variable
          (preprocessor<baryonyx::problem> *this,int variable)

{
  int iVar1;
  pointer ppVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  
  ppVar2 = (this->cache).
           super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = *(int **)&ppVar2[variable].in_equal_constraints.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_equal_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  if (piVar4 != piVar3) {
    do {
      if (0 < (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar4]) {
        return false;
      }
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar3);
  }
  piVar4 = ppVar2[variable].in_greater_constraints.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_greater_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  if (piVar4 != piVar3) {
    do {
      if (0 < (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar4]) {
        return false;
      }
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar3);
  }
  piVar4 = ppVar2[variable].in_less_constraints.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = *(pointer *)
            ((long)&ppVar2[variable].in_less_constraints.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  if (piVar4 != piVar3) {
    do {
      piVar5 = piVar4 + 1;
      iVar1 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar4];
      if (0 < iVar1) {
        return iVar1 < 1;
      }
      piVar4 = piVar5;
    } while (piVar5 != piVar3);
    return iVar1 < 1;
  }
  return true;
}

Assistant:

bool is_unused_variable(int variable)
    {
        for (int cst : cache[variable].in_equal_constraints)
            if (equal_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_greater_constraints)
            if (greater_constraints[cst] > 0)
                return false;
        for (int cst : cache[variable].in_less_constraints)
            if (less_constraints[cst] > 0)
                return false;

        return true;
    }